

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.h
# Opt level: O2

int Assimp::PLY::PropertyInstance::ConvertTo<int>(ValueUnion v,EDataType eType)

{
  switch(eType) {
  case EDT_Char:
  case EDT_UChar:
  case EDT_Short:
  case EDT_UShort:
  case EDT_Int:
  case EDT_UInt:
    return (int)v.fFloat;
  case EDT_Float:
    return (int)v.fFloat;
  case EDT_Double:
    return (int)v.fDouble;
  default:
    return 0;
  }
}

Assistant:

inline TYPE PLY::PropertyInstance::ConvertTo(
    PLY::PropertyInstance::ValueUnion v, PLY::EDataType eType)
{
    switch (eType)
    {
    case EDT_Float:
        return (TYPE)v.fFloat;
    case EDT_Double:
        return (TYPE)v.fDouble;

    case EDT_UInt:
    case EDT_UShort:
    case EDT_UChar:
        return (TYPE)v.iUInt;

    case EDT_Int:
    case EDT_Short:
    case EDT_Char:
        return (TYPE)v.iInt;
    default: ;
    };
    return (TYPE)0;
}